

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O2

uint __thiscall
ON_SubDSectorType::GetAllEigenvalues
          (ON_SubDSectorType *this,double *eigenvalues,size_t eigenvalues_capacity)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint k;
  bool bVar5;
  ON_SubDVertexTag vertex_tag;
  uint uVar6;
  uint sector_edge_count;
  uint uVar7;
  size_t i;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int local_8c;
  
  if (eigenvalues_capacity == 0) {
    eigenvalues = (double *)0x0;
  }
  else {
    if (eigenvalues == (double *)0x0) goto LAB_0061f402;
    for (sVar8 = 0; eigenvalues_capacity != sVar8; sVar8 = sVar8 + 1) {
      eigenvalues[sVar8] = -1.23432101234321e+308;
    }
  }
  bVar5 = IsValid(this);
  if (((bVar5) && (uVar6 = PointRingCount(this), uVar6 != 0)) &&
     (uVar12 = (ulong)uVar6, eigenvalues == (double *)0x0 || uVar12 <= eigenvalues_capacity)) {
    vertex_tag = VertexTag(this);
    sector_edge_count = EdgeCount(this);
    bVar5 = ON_SubD::IsValidSectorEdgeCount(vertex_tag,sector_edge_count);
    if (bVar5) {
      if (vertex_tag == Smooth) {
        if (eigenvalues == (double *)0x0) {
          return uVar6;
        }
        dVar15 = (double)(sector_edge_count * 3 - 7);
        *eigenvalues = 1.0;
        dVar17 = 0.125;
        for (uVar7 = sector_edge_count; (uVar7 != 0 && ((uVar7 & 1) == 0)); uVar7 = uVar7 >> 1) {
          dVar17 = dVar17 * 0.5;
        }
        dVar18 = SQRT((double)((sector_edge_count * 5 + -0x1e) * sector_edge_count + 0x31));
        eigenvalues[1] = (dVar17 / (double)uVar7) * (dVar18 + dVar15);
        eigenvalues[2] = (dVar17 / (double)uVar7) * (dVar15 - dVar18);
        uVar13 = sector_edge_count * 2;
        uVar12 = 1;
        uVar7 = 2;
        local_8c = -1;
        uVar10 = 4;
        while( true ) {
          uVar13 = uVar13 - 2;
          uVar14 = uVar7;
          if (sector_edge_count < uVar7) {
            uVar14 = sector_edge_count;
          }
          if (sector_edge_count <= uVar12) break;
          iVar3 = (int)uVar10;
          uVar11 = iVar3 - 2;
          uVar4 = uVar11;
          if (sector_edge_count < uVar11) {
            uVar4 = uVar13;
          }
          k = sector_edge_count - uVar4;
          if (uVar4 * 2 <= sector_edge_count) {
            k = uVar4;
          }
          dVar15 = eigenvalue_cos(k,sector_edge_count);
          if (sector_edge_count < uVar4 * 2) {
            dVar15 = -dVar15;
          }
          dVar17 = eigenvalue_cos(uVar14 + local_8c,sector_edge_count);
          if (sector_edge_count < uVar11) {
            dVar17 = -dVar17;
          }
          dVar18 = ((double)(uVar12 & 0xffffffff) * 3.141592653589793) / (double)sector_edge_count;
          dVar16 = cos(dVar18 + dVar18);
          if (1e-06 < ABS(dVar15 - dVar16)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                       ,0x74,"","bogus c1");
          }
          dVar18 = cos(dVar18);
          if (1e-06 < ABS(dVar17 - dVar18)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                       ,0x79,"","bogus c2");
          }
          dVar18 = dVar15 + 5.0;
          if ((uVar14 + local_8c) * 4 == sector_edge_count) {
            dVar16 = dVar15 / 9.0 + 1.0;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            dVar16 = (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar16 |
                             (ulong)-dVar16 & -(ulong)(dVar17 < 0.0));
          }
          else {
            dVar16 = dVar15 / 4.5 + 2.0;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            dVar16 = dVar16 * dVar17;
          }
          dVar19 = dVar15 + dVar15 + 18.0;
          dVar20 = SQRT(dVar19);
          dVar15 = dVar20;
          if (dVar19 < 0.0) {
            dVar15 = sqrt(dVar19);
          }
          if (dVar19 < 0.0) {
            dVar20 = sqrt(dVar19);
          }
          dVar19 = (dVar18 - dVar16 * 3.0) * 0.0625;
          if (1e-06 < ABS((dVar18 - dVar15 * dVar17) * 0.0625 - dVar19)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                       ,0x8a,"","bogus lambda0");
          }
          dVar15 = (dVar18 + dVar16 * 3.0) * 0.0625;
          if (1e-06 < ABS((dVar17 * dVar20 + dVar18) * 0.0625 - dVar15)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                       ,0x8f,"","bogus lambda1");
          }
          eigenvalues[iVar3 - 1] = dVar19;
          eigenvalues[uVar10] = dVar15;
          uVar12 = uVar12 + 1;
          uVar7 = uVar7 + 2;
          local_8c = local_8c + -1;
          uVar10 = (ulong)(iVar3 + 2);
        }
        ON_SortDoubleArrayDecreasing(eigenvalues + 1,(ulong)(uVar6 - 1));
      }
      else if (sector_edge_count < 0x15 && vertex_tag == Crease) {
        if (eigenvalues == (double *)0x0) {
          return uVar6;
        }
        if ((sector_edge_count < 2) ||
           (*(ulong *)(GetQuadCreaseEigenvalues(unsigned_int,unsigned_int,double*)::e_sizeof +
                      (ulong)(sector_edge_count - 2) * 8) >> 3 != uVar12)) {
          ON_SubDIncrementErrorCount();
          goto LAB_0061f402;
        }
        lVar2 = *(long *)(GetQuadCreaseEigenvalues(unsigned_int,unsigned_int,double*)::e +
                         (ulong)(sector_edge_count - 2) * 8);
        for (lVar9 = 0; puVar1 = (undefined8 *)(lVar2 + lVar9),
            puVar1 < (undefined8 *)(lVar2 + uVar12 * 8); lVar9 = lVar9 + 8) {
          *(undefined8 *)((long)eigenvalues + lVar9) = *puVar1;
        }
      }
      else if (eigenvalues == (double *)0x0) {
        return 0;
      }
      if ((*eigenvalues == 1.0) && (!NAN(*eigenvalues))) {
        return uVar6;
      }
    }
  }
LAB_0061f402:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::GetAllEigenvalues(
  double* eigenvalues,
  size_t eigenvalues_capacity
  )
{
  if ( 0 == eigenvalues_capacity)
    eigenvalues = nullptr;
  else
  {
    if (nullptr == eigenvalues)
      return ON_SUBD_RETURN_ERROR(0);

    for (size_t i = 0; i < eigenvalues_capacity; i++)
      eigenvalues[i] = ON_UNSET_VALUE;
  }

  if (false == IsValid())
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if ( 0  == R || (nullptr != eigenvalues && eigenvalues_capacity < R))
    return ON_SUBD_RETURN_ERROR(0);

  const ON_SubDVertexTag vertex_tag = VertexTag();
  const unsigned int N = EdgeCount();

  if (false == ON_SubD::IsValidSectorEdgeCount(vertex_tag, N))
    return ON_SUBD_RETURN_ERROR(0);

  if (ON_SubDVertexTag::Smooth == vertex_tag)
  {
    if (nullptr == eigenvalues)
    {
      // caller is asking if eigenvalues are available
      return R;
    }
    eigenvalues[0] = 1.0;

    double a = (3 * N - 7);
    double b = (N >= 6) ? ((5 * N - 30)*N + 49) : ((5 * N*N + 49) - 30 * N);
    double c = sqrt(b);
    double d = 0.125;
    unsigned int D = N;
    while (D > 0 && 0 == (D % 2))
    {
      D /= 2;
      d *= 0.5;
    }
    d /= ((double)D);

    eigenvalues[1] = d*(a + c);
    eigenvalues[2] = d*(a - c);

    for (unsigned int k = 1; k < N; k++)
    {
      double e2[2];
      GetQuadSubdivisionMatrix_eigenvalue_pair(k, N, e2);
      eigenvalues[2 * k + 1] = e2[0];
      eigenvalues[2 * k + 2] = e2[1];
    }

    // return sorted in decreasing order
    ON_SortDoubleArrayDecreasing(eigenvalues + 1, R - 1);
  }
  else if (ON_SubDVertexTag::Crease == vertex_tag)
  {
    if (N <= 20)
    {
      if (nullptr == eigenvalues)
      {
        // caller is asking if eigenvalues are available
        return R;
      }
      if (R != GetQuadCreaseEigenvalues(N, R, eigenvalues) || !(1.0 == eigenvalues[0]))
        return ON_SUBD_RETURN_ERROR(0);
    }
  }

  if (nullptr == eigenvalues)
  {
    // caller is asking if eigenvalues are available
    return 0; // not an error
  }

  if (!(1.0 == eigenvalues[0]))
    return ON_SUBD_RETURN_ERROR(0);

  return R;
}